

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborContainerPrivate::compact(QCborContainerPrivate *this)

{
  Element e_00;
  bool bVar1;
  qsizetype qVar2;
  anon_union_8_2_4ee71171_for_Element_0 o;
  Element *pEVar3;
  ByteData *this_00;
  qptrdiff qVar4;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  ByteData *b;
  Element *e;
  QList<QtCbor::Element> *__range1;
  iterator __end1;
  iterator __begin1;
  size_type newUsedData;
  QByteArray newData;
  QList<QtCbor::Element> *this_01;
  qsizetype *len;
  QByteArray *block;
  QCborContainerPrivate *this_02;
  QByteArray *target;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_44;
  anon_union_8_2_4ee71171_for_Element_0 aVar5;
  iterator local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QList<QtCbor::Element> *)(in_RDI->d).ptr;
  block = in_RDI;
  qVar2 = QByteArray::size((QByteArray *)&(in_RDI->d).size);
  if ((long)this_01 <= qVar2 / 2) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x21b5d6);
    local_28 = (char *)0x0;
    len = &in_RDI[1].d.size;
    local_30.i = (Element *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QtCbor::Element>::begin(this_01);
    o = (anon_union_8_2_4ee71171_for_Element_0)QList<QtCbor::Element>::end(this_01);
    while (aVar5 = o, bVar1 = QList<QtCbor::Element>::iterator::operator!=(&local_30,(iterator)o),
          bVar1) {
      pEVar3 = QList<QtCbor::Element>::iterator::operator*(&local_30);
      local_44.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)
           QFlags<QtCbor::Element::ValueFlag>::operator&
                     ((QFlags<QtCbor::Element::ValueFlag> *)this_01,
                      (ValueFlag)((ulong)in_RDI >> 0x20));
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_44);
      if (bVar1) {
        this_02 = (pEVar3->field_0).container;
        target = *(QByteArray **)&pEVar3->type;
        e_00.type = aVar5._0_4_;
        e_00.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
        super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
             (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
             (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)aVar5._4_4_;
        e_00.field_0.value = o.value;
        this_00 = byteData(this_02,e_00);
        if (this_00 != (ByteData *)0x0) {
          QtCbor::ByteData::byte(this_00);
          qVar4 = addByteDataImpl(target,(size_type *)this_02,(char *)block,(qsizetype)len);
          (pEVar3->field_0).value = qVar4;
        }
      }
      QList<QtCbor::Element>::iterator::operator++(&local_30);
      o = aVar5;
    }
    QByteArray::operator=((QByteArray *)this_01,in_RDI);
    (in_RDI->d).ptr = local_28;
    QByteArray::~QByteArray((QByteArray *)0x21b739);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCborContainerPrivate::compact()
{
    if (usedData > data.size() / 2)
        return;

    // 50% savings if we recreate the byte data
    QByteArray newData;
    QByteArray::size_type newUsedData = 0;
    // Compact only elements that have byte data.
    // Nested containers will be compacted when their data changes.
    for (auto &e : elements) {
        if (e.flags & Element::HasByteData) {
            if (const ByteData *b = byteData(e))
                e.value = addByteDataImpl(newData, newUsedData, b->byte(), b->len);
        }
    }
    data = newData;
    usedData = newUsedData;
}